

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndn-lite-hmac.c
# Opt level: O0

int ndn_hkdf(uint8_t *input_value,uint32_t input_size,uint8_t *output_value,uint32_t output_size,
            uint8_t *seed_value,uint32_t seed_size,uint8_t *info_value,uint32_t info_size)

{
  int iVar1;
  long lVar2;
  uint32_t payload_length;
  undefined1 local_358 [8];
  ndn_hmac_sha256_state_t state;
  int i;
  int N;
  ndn_hmac_key_t prk;
  ndn_hmac_key_t seed_key;
  uint8_t prk_bytes [32];
  uint8_t okm [256];
  uint8_t previous_output [32];
  uint32_t seed_size_local;
  uint8_t *seed_value_local;
  uint32_t output_size_local;
  uint8_t *output_value_local;
  uint32_t input_size_local;
  uint8_t *input_value_local;
  
  if (output_size < 0x101) {
    memset(okm + 0xf8,0,0x20);
    memset(prk_bytes + 0x18,0,0x100);
    memset(&seed_key.abs_key.key_size,0,0x20);
    if (seed_size == 0) {
      ndn_hmac_load_key((ndn_hmac_key_t *)&prk.abs_key.key_size,okm + 0xf8,0x20);
    }
    else {
      ndn_hmac_load_key((ndn_hmac_key_t *)&prk.abs_key.key_size,seed_value,seed_size);
    }
    iVar1 = ndn_hmac_sha256(input_value,input_size,(ndn_hmac_key_t *)&prk.abs_key.key_size,
                            (uint8_t *)&seed_key.abs_key.key_size);
    if (iVar1 == 0) {
      ndn_hmac_load_key((ndn_hmac_key_t *)&i,(uint8_t *)&seed_key.abs_key.key_size,0x20);
      state.abs_state.s.key._124_4_ = output_size >> 5;
      if ((output_size & 0x1f) != 0) {
        state.abs_state.s.key._124_4_ = state.abs_state.s.key._124_4_ + 1;
      }
      state.abs_state.s.key[0x78] = '\x01';
      state.abs_state.s.key[0x79] = '\0';
      state.abs_state.s.key[0x7a] = '\0';
      state.abs_state.s.key[0x7b] = '\0';
      for (; (int)state.abs_state.s.key._120_4_ <= (int)state.abs_state.s.key._124_4_;
          state.abs_state.s.key._120_4_ = state.abs_state.s.key._120_4_ + 1) {
        ndn_hmac_sha256_init((ndn_hmac_sha256_state_t *)local_358,(ndn_hmac_key_t *)&i);
        payload_length = 0x20;
        if (state.abs_state.s.key._120_4_ == 1) {
          payload_length = 0;
        }
        ndn_hmac_sha256_update((ndn_hmac_sha256_state_t *)local_358,okm + 0xf8,payload_length);
        ndn_hmac_sha256_update((ndn_hmac_sha256_state_t *)local_358,info_value,info_size);
        ndn_hmac_sha256_update((ndn_hmac_sha256_state_t *)local_358,state.abs_state.s.key + 0x78,1);
        ndn_hmac_sha256_final((ndn_hmac_sha256_state_t *)local_358,okm + 0xf8);
        lVar2 = (long)((state.abs_state.s.key._120_4_ + -1) * 0x20);
        *(undefined8 *)(prk_bytes + lVar2 + 0x18) = okm._248_8_;
        *(undefined8 *)(okm + lVar2) = previous_output._0_8_;
        *(undefined8 *)(okm + lVar2 + 8) = previous_output._8_8_;
        *(undefined8 *)(okm + lVar2 + 0x10) = previous_output._16_8_;
      }
      memcpy(output_value,prk_bytes + 0x18,(ulong)output_size);
      input_value_local._4_4_ = 0;
    }
    else {
      input_value_local._4_4_ = -0x19;
    }
  }
  else {
    input_value_local._4_4_ = -0x12;
  }
  return input_value_local._4_4_;
}

Assistant:

int
ndn_hkdf(const uint8_t* input_value, uint32_t input_size,
         uint8_t* output_value, uint32_t output_size,
         const uint8_t* seed_value, uint32_t seed_size,
         const uint8_t* info_value, uint32_t info_size)
{
  // parameter check
  if (output_size > NDN_SEC_HMAC_MAX_OUTPUT_SIZE) {
    return NDN_INVALID_ARG;
  }

  // state
  uint8_t previous_output[NDN_SEC_SHA256_HASH_SIZE] = {0};
  uint8_t okm[NDN_SEC_HMAC_MAX_OUTPUT_SIZE] = {0};

  // HKDF extract
  uint8_t prk_bytes[NDN_SEC_SHA256_HASH_SIZE] = {0};
  ndn_hmac_key_t seed_key;
  if (seed_size == 0) {
    ndn_hmac_load_key(&seed_key, previous_output, NDN_SEC_SHA256_HASH_SIZE);
  }
  else {
    ndn_hmac_load_key(&seed_key, seed_value, seed_size);
  }
  if (ndn_hmac_sha256(input_value, input_size, &seed_key, prk_bytes) != NDN_SUCCESS) {
    return NDN_SEC_CRYPTO_ALGO_FAILURE;
  }

  // load prk
  ndn_hmac_key_t prk;
  ndn_hmac_load_key(&prk, prk_bytes, NDN_SEC_SHA256_HASH_SIZE);

  // HKDF expand
  int N = output_size / NDN_SEC_SHA256_HASH_SIZE;
  if (output_size % NDN_SEC_SHA256_HASH_SIZE)
    N += 1;
  for (int i = 1; i <= N; i++) {
    ndn_hmac_sha256_state_t state;
    ndn_hmac_sha256_init(&state, &prk);
    ndn_hmac_sha256_update(&state, previous_output, i == 1 ? 0 : NDN_SEC_SHA256_HASH_SIZE);
    ndn_hmac_sha256_update(&state, info_value, info_size);
    ndn_hmac_sha256_update(&state, &i, 1);
    ndn_hmac_sha256_final(&state, previous_output);
    memcpy(okm + (i - 1) * NDN_SEC_SHA256_HASH_SIZE, previous_output, NDN_SEC_SHA256_HASH_SIZE);
  }
  memcpy(output_value, okm, output_size);
  return NDN_SUCCESS;
}